

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O2

string * benchmark::LocalDateTimeString_abi_cxx11_(void)

{
  size_t sVar1;
  string *in_RDI;
  time_t now;
  tm timeinfo;
  char storage [128];
  long local_e0;
  tm local_d8;
  char local_98 [136];
  
  local_e0 = std::chrono::_V2::system_clock::now();
  local_e0 = local_e0 / 1000000000;
  local_d8.tm_isdst = 0;
  local_d8._36_4_ = 0;
  local_d8.tm_gmtoff = 0;
  local_d8.tm_mon = 0;
  local_d8.tm_year = 0;
  local_d8.tm_wday = 0;
  local_d8.tm_yday = 0;
  local_d8.tm_sec = 0;
  local_d8.tm_min = 0;
  local_d8.tm_hour = 0;
  local_d8.tm_mday = 0;
  local_d8.tm_zone = (char *)0x0;
  localtime_r(&local_e0,&local_d8);
  sVar1 = strftime(local_98,0x80,"%F %T",&local_d8);
  if (sVar1 < 0x80) {
    internal::GetNullLogInstance();
    std::__cxx11::string::string((string *)in_RDI,local_98,(allocator *)&local_d8);
    return in_RDI;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&local_d8,"written < arraysize(storage)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/walltime.cc"
             ,"DateTimeString",0xfc);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_d8);
}

Assistant:

std::string LocalDateTimeString() {
  return DateTimeString(true);
}